

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

InterpreterStackFrame *
Js::InterpreterStackFrame::CreateInterpreterStackFrameForGenerator
          (ScriptFunction *function,FunctionBody *executeFunction,JavascriptGenerator *generator,
          bool doProfile)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  LocalFunctionId functionId;
  RegSlot RVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  ByteCodeReader *this;
  undefined8 *invalidStackVar;
  FunctionBody *pFVar7;
  BailInSymbol *ptr;
  undefined7 in_register_00000009;
  undefined1 local_d8 [8];
  Setup setup;
  Arguments generatorArgs;
  TrackAllocData data;
  JavascriptGenerator *local_48;
  JavascriptGenerator *generator_local;
  undefined4 local_34;
  
  pSVar1 = (((((function->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
               super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
  setup._56_8_ = (generator->args).Info;
  generatorArgs.Info = (Type)(generator->args).Values;
  local_48 = generator;
  Setup::Setup((Setup *)local_d8,function,(Arguments *)&setup.bailedOut,false,false,true);
  if (setup.localCount != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x74d,"(setup.GetStackAllocationVarCount() == 0)",
                                "setup.GetStackAllocationVarCount() == 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  local_34 = (undefined4)CONCAT71(in_register_00000009,doProfile);
  bVar3 = FunctionBody::GetHasAllocatedLoopHeaders(executeFunction);
  if (bVar3) {
    generator_local = (JavascriptGenerator *)FunctionBody::GetLoopHeaderArrayPtr(executeFunction);
  }
  else {
    generator_local = (JavascriptGenerator *)0x0;
  }
  generatorArgs.Values = &void*::typeinfo;
  pRVar6 = Memory::Recycler::TrackAllocInfo
                     (pSVar1->recycler,(TrackAllocData *)&generatorArgs.Values);
  this = (ByteCodeReader *)new<Memory::Recycler>(8,pRVar6,0x37ff80,0);
  this->m_startLocation = (byte *)0x0;
  generatorArgs.Values = &void*::typeinfo;
  pRVar6 = Memory::Recycler::TrackAllocInfo
                     (pSVar1->recycler,(TrackAllocData *)&generatorArgs.Values);
  invalidStackVar = (undefined8 *)new<Memory::Recycler>(8,pRVar6,0x37fe86,0);
  *invalidStackVar = 0xfefefefefefefefe;
  invalidStackVar[1] = 0xfefefefefefefefe;
  Setup::InitializeAllocation
            ((Setup *)local_d8,(Var *)this,(Var *)0x0,
             (bool)(((executeFunction->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 &
                    4) >> 2),local_34._0_1_,(LoopHeader *)generator_local,(DWORD_PTR)&local_48,
             invalidStackVar);
  ByteCodeReader::Create(this,executeFunction,0);
  JavascriptGenerator::SetFrame
            (local_48,(InterpreterStackFrame *)this,(ulong)(uint)setup.inSlotsCount << 3);
  pFVar7 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
  pFVar7 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar7);
  bVar3 = Phases::IsEnabled((Phases *)&DAT_01453738,BailInPhase,sourceContextId,functionId);
  if (bVar3) {
    pRVar6 = pSVar1->recycler;
    pFVar7 = FunctionProxy::GetFunctionBody((FunctionProxy *)executeFunction);
    FunctionBody::GetLocalsCount(pFVar7);
    generatorArgs.Values = &JavascriptGenerator::BailInSymbol::typeinfo;
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,(TrackAllocData *)&generatorArgs.Values);
    pFVar7 = FunctionProxy::GetFunctionBody((FunctionProxy *)executeFunction);
    RVar4 = FunctionBody::GetLocalsCount(pFVar7);
    ptr = Memory::AllocateArray<Memory::Recycler,Js::JavascriptGenerator::BailInSymbol,false>
                    ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeafZero,0,(ulong)RVar4);
    Memory::WriteBarrierPtr<Js::JavascriptGenerator::BailInSymbol>::WriteBarrierSet
              (&local_48->bailInSymbolsTraceArray,ptr);
  }
  return (InterpreterStackFrame *)this;
}

Assistant:

InterpreterStackFrame* InterpreterStackFrame::CreateInterpreterStackFrameForGenerator(ScriptFunction* function, FunctionBody* executeFunction, JavascriptGenerator* generator, bool doProfile)
    {
        //
        // Allocate a new InterpreterStackFrame instance on the recycler heap.
        // It will live with the JavascriptGenerator object.
        //
        ScriptContext* functionScriptContext = function->GetScriptContext();
        Arguments generatorArgs = generator->GetArguments();
        InterpreterStackFrame::Setup setup(function, generatorArgs, false /* bailedOut */, false /* inlinee */, true /* isGeneratorFrame */);
        Assert(setup.GetStackAllocationVarCount() == 0);
        size_t varAllocCount = setup.GetAllocationVarCount();
        size_t varSizeInBytes = varAllocCount * sizeof(Var);
        DWORD_PTR stackAddr = reinterpret_cast<DWORD_PTR>(&generator); // use any stack address from this frame to ensure correct debugging functionality
        LoopHeader* loopHeaderArray = executeFunction->GetHasAllocatedLoopHeaders() ? executeFunction->GetLoopHeaderArrayPtr() : nullptr;

        Var* allocation = RecyclerNewPlus(functionScriptContext->GetRecycler(), varSizeInBytes, Var);
        AnalysisAssert(allocation);
        InterpreterStackFrame* newInstance;
#if DBG
        // Allocate invalidVar on GC instead of stack since this InterpreterStackFrame will out live the current real frame
        Js::RecyclableObject* invalidVar = (Js::RecyclableObject*)RecyclerNewPlusLeaf(functionScriptContext->GetRecycler(), sizeof(Js::RecyclableObject), Var);
        AnalysisAssert(invalidVar);
        memset(reinterpret_cast<void*>(invalidVar), 0xFE, sizeof(Js::RecyclableObject));
#endif

        newInstance = setup.InitializeAllocation(allocation, nullptr, executeFunction->GetHasImplicitArgIns(), doProfile, loopHeaderArray, stackAddr
#if DBG
            , invalidVar
#endif
            );

        newInstance->m_reader.Create(executeFunction);

        generator->SetFrame(newInstance, varSizeInBytes);

        // Moving this to when we create the generator instance in the first place would be nice.
        // But at that point the function might not have been parsed yet, so we don't have the locals count.
        // We are also allocating more space than we actually need because we shouldn't need to
        // reload all the symbols when bailing in.
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (PHASE_TRACE(Js::Phase::BailInPhase, function->GetFunctionBody()))
        {
            generator->bailInSymbolsTraceArray = (Js::JavascriptGenerator::BailInSymbol*) RecyclerNewArrayLeafZ(
                functionScriptContext->GetRecycler(), Js::JavascriptGenerator::BailInSymbol, executeFunction->GetFunctionBody()->GetLocalsCount()
            );
        }
#endif

        return newInstance;
    }